

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

string * __thiscall polyscope::CurveNetwork::getMaterial_abi_cxx11_(CurveNetwork *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long in_RSI;
  string *in_RDI;
  
  pbVar1 = PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(in_RSI + 0x8a0));
  std::__cxx11::string::string((string *)in_RDI,(string *)pbVar1);
  return in_RDI;
}

Assistant:

std::string CurveNetwork::getMaterial() { return material.get(); }